

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

void __thiscall iutest::detail::IParamTestSuiteInfo::~IParamTestSuiteInfo(IParamTestSuiteInfo *this)

{
  IParamTestSuiteInfo *this_local;
  
  this->_vptr_IParamTestSuiteInfo = (_func_int **)&PTR__IParamTestSuiteInfo_0018b908;
  std::__cxx11::string::~string((string *)&this->m_package_name);
  std::__cxx11::string::~string((string *)&this->m_testsuite_base_name);
  std::
  vector<iutest::detail::IParamTestInfoData_*,_std::allocator<iutest::detail::IParamTestInfoData_*>_>
  ::~vector(&this->m_testinfos);
  return;
}

Assistant:

virtual ~IParamTestSuiteInfo() {}